

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dukvalue.h
# Opt level: O0

string * __thiscall DukValue::as_string_abi_cxx11_(DukValue *this)

{
  DukException *this_00;
  DukException *pDVar1;
  char *rhs;
  DukException local_38;
  DukValue *local_10;
  DukValue *this_local;
  
  if (this->mType != STRING) {
    local_10 = this;
    this_00 = (DukException *)__cxa_allocate_exception(0x28);
    local_38.mMsg._M_string_length = 0;
    local_38.mMsg.field_2._M_allocated_capacity = 0;
    local_38.super_exception = (exception)0x0;
    local_38._1_7_ = 0;
    local_38.mMsg._M_dataplus = (_Alloc_hider)0x0;
    local_38.mMsg._1_7_ = 0;
    local_38.mMsg.field_2._8_8_ = 0;
    DukException::DukException(&local_38);
    pDVar1 = DukException::operator<<(&local_38,"Expected string, got ");
    rhs = type_name(this);
    pDVar1 = DukException::operator<<(pDVar1,rhs);
    DukException::DukException(this_00,pDVar1);
    __cxa_throw(this_00,&DukException::typeinfo,DukException::~DukException);
  }
  return &this->mString;
}

Assistant:

inline const std::string& as_string() const {
		if (mType != STRING)
			throw DukException() << "Expected string, got " << type_name();
		return mString;
	}